

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O0

void cmCacheManager::OutputValue(ostream *fout,string *value)

{
  undefined1 local_40 [8];
  string truncated;
  size_type newline;
  string *value_local;
  ostream *fout_local;
  
  truncated.field_2._8_8_ = std::__cxx11::string::find((char)value,10);
  if (truncated.field_2._8_8_ == -1) {
    OutputValueNoNewlines(fout,value);
  }
  else {
    std::__cxx11::string::substr((ulong)local_40,(ulong)value);
    OutputValueNoNewlines(fout,(string *)local_40);
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void cmCacheManager::OutputValue(std::ostream& fout, std::string const& value)
{
  // look for and truncate newlines
  std::string::size_type newline = value.find('\n');
  if (newline != std::string::npos) {
    std::string truncated = value.substr(0, newline);
    OutputValueNoNewlines(fout, truncated);
  } else {
    OutputValueNoNewlines(fout, value);
  }
}